

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O3

void __thiscall MemoryImage::getPage(MemoryImage *this,uintb addr,uint1 *res,int4 skip,int4 size)

{
  (*this->loader->_vptr_LoadImage[2])(this->loader,res,(ulong)(uint)size);
  return;
}

Assistant:

void MemoryImage::getPage(uintb addr,uint1 *res,int4 skip,int4 size) const

{  // Assume that -addr- is page aligned
  AddrSpace *spc = getSpace();

  try {
    loader->loadFill(res,size,Address(spc,addr+skip));
  }
  catch(DataUnavailError &err) {
    // Pages not mapped in the load image, are assumed to be zero
    for(int4 i=0;i<size;++i)
      res[i] = 0;
  }
}